

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int r4k_map_address_mips
              (CPUMIPSState *env,hwaddr *physical,int *prot,target_ulong_conflict address,int rw,
              int access_type)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  uint local_68;
  uint local_64;
  int n;
  target_ulong_conflict VPN;
  target_ulong_conflict tag;
  target_ulong_conflict mask;
  r4k_tlb_t *tlb;
  int i;
  uint32_t tlb_mmid;
  _Bool mi;
  uint32_t MMID;
  uint16_t ASID;
  int access_type_local;
  int rw_local;
  target_ulong_conflict address_local;
  int *prot_local;
  hwaddr *physical_local;
  CPUMIPSState *env_local;
  
  local_64 = env->CP0_MemoryMapID;
  bVar5 = (env->CP0_Config5 >> 0x11 & 1U) == 0;
  if (bVar5) {
    local_64 = (uint)(ushort)((ushort)env->CP0_EntryHi & (ushort)env->CP0_EntryHi_ASID_mask);
  }
  tlb._0_4_ = 0;
  while( true ) {
    if (env->tlb->tlb_in_use <= (uint)tlb) {
      return -2;
    }
    puVar4 = (uint *)((long)&env->tlb->mmu + (long)(int)(uint)tlb * 0x28);
    uVar2 = puVar4[1] | 0x1fff;
    if (bVar5) {
      local_68 = (uint)(ushort)puVar4[2];
    }
    else {
      local_68 = puVar4[3];
    }
    if (((((puVar4[4] & 1) == 1) || (local_68 == local_64)) &&
        ((*puVar4 & (uVar2 ^ 0xffffffff)) == (address & (uVar2 ^ 0xffffffff)))) &&
       (-1 < (short)puVar4[4])) break;
    tlb._0_4_ = (uint)tlb + 1;
  }
  uVar3 = (uint)((address & uVar2 & (uVar2 >> 1 ^ 0xffffffff)) != 0);
  if (uVar3 == 0) {
    uVar1 = (ushort)puVar4[4] >> 7;
  }
  else {
    uVar1 = (ushort)puVar4[4] >> 8;
  }
  if ((uVar1 & 1) != 0) {
    if (rw == 2) {
      if (uVar3 == 0) {
        uVar1 = (ushort)puVar4[4] >> 0xb;
      }
      else {
        uVar1 = (ushort)puVar4[4] >> 0xc;
      }
      if ((uVar1 & 1) != 0) {
        return -6;
      }
    }
    if (rw == 0) {
      if (uVar3 == 0) {
        uVar1 = (ushort)puVar4[4] >> 0xd;
      }
      else {
        uVar1 = (ushort)puVar4[4] >> 0xe;
      }
      if ((uVar1 & 1) != 0) {
        return -5;
      }
    }
    if (rw == 1) {
      if (uVar3 == 0) {
        uVar1 = (ushort)puVar4[4] >> 9;
      }
      else {
        uVar1 = (ushort)puVar4[4] >> 10;
      }
      if ((uVar1 & 1) == 0) {
        return -4;
      }
    }
    *physical = *(ulong *)(puVar4 + (long)(int)uVar3 * 2 + 6) | (ulong)(address & uVar2 >> 1);
    *prot = 1;
    if (uVar3 == 0) {
      uVar1 = (ushort)puVar4[4] >> 9;
    }
    else {
      uVar1 = (ushort)puVar4[4] >> 10;
    }
    if ((uVar1 & 1) != 0) {
      *prot = *prot | 2;
    }
    if (uVar3 == 0) {
      uVar1 = (ushort)puVar4[4] >> 0xb;
    }
    else {
      uVar1 = (ushort)puVar4[4] >> 0xc;
    }
    if ((uVar1 & 1) == 0) {
      *prot = *prot | 4;
    }
    return 0;
  }
  return -3;
}

Assistant:

int r4k_map_address(CPUMIPSState *env, hwaddr *physical, int *prot,
                    target_ulong address, int rw, int access_type)
{
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;

    for (i = 0; i < env->tlb->tlb_in_use; i++) {
        r4k_tlb_t *tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        target_ulong mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        target_ulong tag = address & ~mask;
        target_ulong VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif

        /* Check ASID/MMID, virtual page number & size */
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            int n = !!(address & mask & ~(mask >> 1));
            /* Check access rights */
            if (!(n ? tlb->V1 : tlb->V0)) {
                return TLBRET_INVALID;
            }
            if (rw == MMU_INST_FETCH && (n ? tlb->XI1 : tlb->XI0)) {
                return TLBRET_XI;
            }
            if (rw == MMU_DATA_LOAD && (n ? tlb->RI1 : tlb->RI0)) {
                return TLBRET_RI;
            }
            if (rw != MMU_DATA_STORE || (n ? tlb->D1 : tlb->D0)) {
                *physical = tlb->PFN[n] | (address & (mask >> 1));
                *prot = PAGE_READ;
                if (n ? tlb->D1 : tlb->D0) {
                    *prot |= PAGE_WRITE;
                }
                if (!(n ? tlb->XI1 : tlb->XI0)) {
                    *prot |= PAGE_EXEC;
                }
                return TLBRET_MATCH;
            }
            return TLBRET_DIRTY;
        }
    }
    return TLBRET_NOMATCH;
}